

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O3

void __thiscall picobench::runner::run_benchmarks(runner *this,int random_seed)

{
  char **__dest;
  pointer psVar1;
  ostream *poVar2;
  char *pcVar3;
  __uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> __s;
  runner *prVar4;
  int iVar5;
  size_t sVar6;
  pointer prVar7;
  pthread_t __th;
  pointer prVar8;
  ulong uVar9;
  ulong uVar10;
  rsuite *suite;
  pointer prVar11;
  pointer piVar12;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *rb;
  pointer prVar13;
  byte bVar14;
  int iVar15;
  unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_> *b;
  vector<int,_std::allocator<int>_> *pvVar16;
  int iters;
  pointer local_13f8;
  iterator iStack_13f0;
  benchmark_impl **local_13e8;
  pointer local_13e0;
  pointer local_13d8;
  pointer local_13d0;
  runner *local_13c8;
  vector<int,_std::allocator<int>_> *local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  if (random_seed == -1) {
    std::random_device::random_device((random_device *)&local_13b8.field_0);
    random_seed = std::random_device::_M_getval();
    std::random_device::_M_fini();
  }
  uVar10 = (ulong)(long)random_seed % 0x7fffffff +
           (ulong)((ulong)(long)random_seed % 0x7fffffff == 0);
  local_13f8 = (pointer)0x0;
  iStack_13f0._M_current = (benchmark_impl **)0x0;
  local_13e8 = (benchmark_impl **)0x0;
  prVar11 = (this->super_registry)._suites.
            super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_13d0 = (this->super_registry)._suites.
               super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
               super__Vector_impl_data._M_finish;
  prVar4 = this;
  if (prVar11 != local_13d0) {
    do {
      local_13c8 = prVar4;
      prVar8 = (pointer)(prVar11->benchmarks).
                        super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      if (prVar8 == (pointer)(prVar11->benchmarks).
                             super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001067f1:
        prVar13 = (pointer)(prVar11->benchmarks).
                           super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        if (prVar13 != prVar8) {
          prVar13->name[0x10] = '\x01';
        }
      }
      else {
        uVar9 = 0;
        prVar13 = prVar8;
        do {
          local_13b8.field_0._M_file = prVar13->name;
          psVar1 = (((benchmark_impl *)local_13b8.field_0._M_file)->_states).
                   super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(((benchmark_impl *)local_13b8.field_0._M_file)->_states).
                       super__Vector_base<picobench::state,_std::allocator<picobench::state>_>.
                       _M_impl.super__Vector_impl_data + 8) != psVar1) {
            *(pointer *)
             ((long)&(((benchmark_impl *)local_13b8.field_0._M_file)->_states).
                     super__Vector_base<picobench::state,_std::allocator<picobench::state>_>._M_impl
                     .super__Vector_impl_data + 8) = psVar1;
            local_13b8.field_0._M_file = prVar13->name;
          }
          if (iStack_13f0._M_current == local_13e8) {
            std::vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>::
            _M_realloc_insert<picobench::benchmark_impl*>
                      ((vector<picobench::benchmark_impl*,std::allocator<picobench::benchmark_impl*>>
                        *)&local_13f8,iStack_13f0,(benchmark_impl **)&local_13b8);
          }
          else {
            *iStack_13f0._M_current = (benchmark_impl *)local_13b8.field_0._M_file;
            iStack_13f0._M_current = iStack_13f0._M_current + 1;
          }
          bVar14 = (byte)uVar9 | prVar13->name[0x10];
          local_13d8 = (pointer)CONCAT44(local_13d8._4_4_,(int)CONCAT71((int7)(uVar9 >> 8),bVar14));
          prVar8 = (pointer)&prVar13->benchmarks;
          prVar7 = (pointer)(prVar11->benchmarks).
                            super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          local_13e0 = prVar8;
          if (prVar8 == prVar7) {
            if ((bVar14 & 1) != 0) goto LAB_00106801;
            goto LAB_001067f1;
          }
          do {
            if ((_Head_base<0UL,_picobench::benchmark_impl_*,_false>)
                *(_Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                  *)(prVar13->name + 8) ==
                (benchmark_impl *)
                (((benchmarks_vector *)prVar8)->
                super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                ._M_t) {
              poVar2 = local_13c8->_stdwarn;
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Warning: ",9);
              pcVar3 = *(char **)prVar13->name;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
              }
              else {
                sVar6 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," and ",5);
              __s._M_t.
              super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
              .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl =
                   (((((benchmarks_vector *)prVar8)->
                     super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>
                   ._M_t;
              if ((_Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                   )__s._M_t.
                    super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                    .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>._M_head_impl ==
                  (benchmark_impl *)0x0) {
                std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
              }
              else {
                sVar6 = strlen((char *)__s._M_t.
                                       super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                                       .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>.
                                       _M_head_impl);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar2,(char *)__s._M_t.
                                          super__Tuple_impl<0UL,_picobench::benchmark_impl_*,_std::default_delete<picobench::benchmark_impl>_>
                                          .super__Head_base<0UL,_picobench::benchmark_impl_*,_false>
                                          ._M_head_impl,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar2," are benchmarks of the same function.\n",0x26);
              prVar7 = (pointer)(prVar11->benchmarks).
                                super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
            }
            prVar8 = (pointer)&(((benchmarks_vector *)prVar8)->
                               super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
          } while (prVar8 != prVar7);
          uVar9 = (ulong)local_13d8 & 0xffffffff;
          prVar13 = local_13e0;
        } while (local_13e0 != prVar7);
        prVar8 = local_13e0;
        if (((ulong)local_13d8 & 1) == 0) goto LAB_001067f1;
      }
LAB_00106801:
      prVar11 = prVar11 + 1;
      prVar4 = local_13c8;
    } while (prVar11 != local_13d0);
    local_13d0 = (pointer)iStack_13f0._M_current;
    if (local_13f8 != (pointer)iStack_13f0._M_current) {
      local_13c0 = &local_13c8->_default_state_iterations;
      prVar11 = local_13f8;
      do {
        pcVar3 = prVar11->name;
        pvVar16 = (vector<int,_std::allocator<int>_> *)(pcVar3 + 0x20);
        if (*(long *)(pcVar3 + 0x20) == *(long *)(pcVar3 + 0x28)) {
          pvVar16 = local_13c0;
        }
        iVar5 = *(int *)(pcVar3 + 0x38);
        if (iVar5 == 0) {
          iVar5 = local_13c8->_default_samples;
          *(int *)(pcVar3 + 0x38) = iVar5;
        }
        std::vector<picobench::state,_std::allocator<picobench::state>_>::reserve
                  ((vector<picobench::state,_std::allocator<picobench::state>_> *)(pcVar3 + 0x40),
                   (long)iVar5 *
                   ((long)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        piVar12 = (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        local_13d8 = (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
        local_13e0 = prVar11;
        if (piVar12 != local_13d8) {
          iVar5 = *(int *)(pcVar3 + 0x38);
          do {
            local_13b8._0_4_ = *piVar12;
            if (0 < iVar5) {
              iVar15 = 0;
              do {
                uVar10 = (uVar10 * 0xbc8f) % 0x7fffffff;
                std::vector<picobench::state,std::allocator<picobench::state>>::
                _M_emplace_aux<int&,unsigned_long&>
                          ((vector<picobench::state,std::allocator<picobench::state>> *)
                           (pcVar3 + 0x40),
                           (state *)(*(long *)(pcVar3 + 0x40) +
                                    (uVar10 % ((*(long *)(pcVar3 + 0x48) - *(long *)(pcVar3 + 0x40)
                                               >> 3) * -0x3333333333333333 + 1U)) * 0x28),
                           (int *)&local_13b8,(unsigned_long *)(pcVar3 + 0x18));
                iVar15 = iVar15 + 1;
                iVar5 = *(int *)(pcVar3 + 0x38);
              } while (iVar15 < iVar5);
            }
            piVar12 = piVar12 + 1;
          } while (piVar12 != local_13d8);
        }
        *(undefined8 *)(pcVar3 + 0x58) = *(undefined8 *)(pcVar3 + 0x40);
        prVar11 = (pointer)&local_13e0->benchmarks;
      } while (prVar11 != local_13d0);
    }
  }
  local_13b8._104_8_ = 0;
  local_13b8._112_8_ = 0;
  local_13b8._88_8_ = 0;
  local_13b8._96_8_ = 0;
  local_13b8._72_8_ = 0;
  local_13b8._80_8_ = 0;
  local_13b8._56_8_ = 0;
  local_13b8._64_8_ = 0;
  local_13b8._40_8_ = 0;
  local_13b8._48_8_ = 0;
  local_13b8._24_8_ = 0;
  local_13b8._32_8_ = 0;
  local_13b8.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  local_13b8._16_8_ = 0;
  local_13b8._120_8_ = 0;
  local_13b8.field_0._M_file = (void *)0x1;
  __th = pthread_self();
  pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&local_13b8.field_0);
  while (prVar11 = local_13f8, local_13f8 != (pointer)iStack_13f0._M_current) {
    uVar10 = (uVar10 * 0xbc8f) % 0x7fffffff;
    uVar9 = uVar10 % (ulong)((long)iStack_13f0._M_current - (long)local_13f8 >> 3);
    (**(code **)((&local_13f8->name)[uVar9] + 8))(*(state **)((&local_13f8->name)[uVar9] + 0x58));
    __dest = &prVar11->name + uVar9;
    *(long *)(*__dest + 0x58) = *(long *)(*__dest + 0x58) + 0x28;
    if (*(long *)(*__dest + 0x58) == *(long *)(*__dest + 0x48)) {
      prVar11 = (pointer)(__dest + 1);
      if (prVar11 != (pointer)iStack_13f0._M_current) {
        memmove(__dest,prVar11,(long)iStack_13f0._M_current - (long)prVar11);
      }
      iStack_13f0._M_current =
           (benchmark_impl **)
           &(((pointer)((long)iStack_13f0._M_current + -0x20))->benchmarks).
            super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (local_13f8 != (pointer)0x0) {
    operator_delete(local_13f8);
  }
  return;
}

Assistant:

void run_benchmarks(int random_seed = -1)
    {
        I_PICOBENCH_ASSERT(_error == no_error && _should_run);

        if (random_seed == -1)
        {
            random_seed = int(std::random_device()());
        }

        std::minstd_rand rnd(random_seed);

        // vector of all benchmarks
        std::vector<benchmark_impl*> benchmarks;
        for (auto& suite : _suites)
        {
            // also identify a baseline in this loop
            // if there is no explicit one, set the first one as a baseline
            bool found_baseline = false;
            for (auto irb = suite.benchmarks.begin(); irb != suite.benchmarks.end(); ++irb)
            {
                auto& rb = *irb;
                rb->_states.clear(); // clear states so we can safely call run_benchmarks multiple times
                benchmarks.push_back(rb.get());
                if (rb->_baseline)
                {
                    found_baseline = true;
                }

#if !defined(PICOBENCH_STD_FUNCTION_BENCHMARKS)
                // check for same func
                for (auto ib = irb+1; ib != suite.benchmarks.end(); ++ib)
                {
                    auto& b = *ib;
                    if (rb->_proc == b->_proc)
                    {
                        *_stdwarn << "Warning: " << rb->name() << " and " << b->name()
                                 << " are benchmarks of the same function.\n";
                    }
                }
#endif
            }

            if (!found_baseline && !suite.benchmarks.empty())
            {
                suite.benchmarks.front()->_baseline = true;
            }
        }

        // initialize benchmarks
        for (auto b : benchmarks)
        {
            const std::vector<int>& state_iterations =
                b->_state_iterations.empty() ?
                _default_state_iterations :
                b->_state_iterations;

            if (b->_samples == 0)
                b->_samples = _default_samples;

            b->_states.reserve(state_iterations.size() * size_t(b->_samples));

            // fill states while random shuffling them
            for (auto iters : state_iterations)
            {
                for (int i = 0; i < b->_samples; ++i)
                {
                    auto index = rnd() % (b->_states.size() + 1);
                    auto pos = b->_states.begin() + long(index);
                    b->_states.emplace(pos, iters, b->_user_data);
                }
            }

            b->_istate = b->_states.begin();
        }

#if !defined(PICOBENCH_DONT_BIND_TO_ONE_CORE)
        // set thread affinity to first cpu
        // so the high resolution clock doesn't miss cycles
        {
#if defined(_WIN32)
        SetThreadAffinityMask(GetCurrentThread(), 1);
#elif defined(__APPLE__)
        thread_affinity_policy_data_t policy = {0};
        thread_policy_set(
            pthread_mach_thread_np(pthread_self()),
            THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#else
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(0, &cpuset);

        pthread_t cur = pthread_self();
        pthread_setaffinity_np(cur, sizeof(cpu_set_t), &cpuset);
#endif
        }
#endif

        // we run a random benchmark from it incrementing _istate for each
        // when _istate reaches _states.end(), we erase the benchmark
        // when the vector becomes empty, we're done
        while (!benchmarks.empty())
        {
            auto i = benchmarks.begin() + long(rnd() % benchmarks.size());
            auto& b = *i;

            b->_proc(*b->_istate);

            ++b->_istate;

            if (b->_istate == b->_states.end())
            {
                benchmarks.erase(i);
            }
        }
    }